

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  Tables *pTVar1;
  DescriptorPool *pDVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  string *psVar8;
  size_type sVar9;
  reference __lhs;
  FileDescriptor *pFVar10;
  DescriptorBuilder *pDVar11;
  FileDescriptor *result;
  StringPiece local_58;
  int local_44;
  ulong uStack_40;
  int i_1;
  size_t i;
  DescriptorBuilder *local_28;
  FileDescriptor *existing_file;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  existing_file = (FileDescriptor *)proto;
  proto_local = (FileDescriptorProto *)this;
  psVar8 = FileDescriptorProto::name_abi_cxx11_(proto);
  std::__cxx11::string::operator=((string *)&this->filename_,(string *)psVar8);
  pTVar1 = this->tables_;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            ((StringPiece *)&i,&this->filename_);
  local_28 = (DescriptorBuilder *)DescriptorPool::Tables::FindFile(pTVar1,_i);
  if ((local_28 == (DescriptorBuilder *)0x0) ||
     (bVar5 = ExistingFileMatchesProto
                        ((FileDescriptor *)local_28,(FileDescriptorProto *)existing_file), !bVar5))
  {
    for (uStack_40 = 0; uVar4 = uStack_40,
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->tables_->pending_files_), uVar4 < sVar9; uStack_40 = uStack_40 + 1) {
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->tables_->pending_files_,uStack_40);
      psVar8 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)existing_file);
      _Var6 = std::operator==(__lhs,psVar8);
      if (_Var6) {
        AddRecursiveImportError(this,(FileDescriptorProto *)existing_file,(int)uStack_40);
        return (FileDescriptor *)0x0;
      }
    }
    if (((this->pool_->lazily_build_dependencies_ & 1U) == 0) &&
       (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
      pTVar1 = this->tables_;
      psVar8 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)existing_file);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pTVar1->pending_files_,psVar8);
      for (local_44 = 0; iVar3 = local_44,
          iVar7 = FileDescriptorProto::dependency_size((FileDescriptorProto *)existing_file),
          iVar3 < iVar7; local_44 = local_44 + 1) {
        pTVar1 = this->tables_;
        psVar8 = FileDescriptorProto::dependency_abi_cxx11_
                           ((FileDescriptorProto *)existing_file,local_44);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_58,psVar8);
        pFVar10 = DescriptorPool::Tables::FindFile(pTVar1,local_58);
        bVar5 = false;
        if ((pFVar10 == (FileDescriptor *)0x0) &&
           (bVar5 = true, this->pool_->underlay_ != (DescriptorPool *)0x0)) {
          pDVar2 = this->pool_->underlay_;
          psVar8 = FileDescriptorProto::dependency_abi_cxx11_
                             ((FileDescriptorProto *)existing_file,local_44);
          pFVar10 = DescriptorPool::FindFileByName(pDVar2,psVar8);
          bVar5 = pFVar10 == (FileDescriptor *)0x0;
        }
        if (bVar5) {
          pDVar2 = this->pool_;
          psVar8 = FileDescriptorProto::dependency_abi_cxx11_
                             ((FileDescriptorProto *)existing_file,local_44);
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                    ((StringPiece *)&result,psVar8);
          DescriptorPool::TryFindFileInFallbackDatabase(pDVar2,_result);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&this->tables_->pending_files_);
    }
    DescriptorPool::Tables::AddCheckpoint(this->tables_);
    pDVar11 = (DescriptorBuilder *)BuildFileImpl(this,(FileDescriptorProto *)existing_file);
    FileDescriptorTables::FinalizeTables(this->file_tables_);
    this_local = pDVar11;
    if (pDVar11 == (DescriptorBuilder *)0x0) {
      DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
    }
    else {
      DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
      (pDVar11->filename_).field_0x1 = 1;
    }
  }
  else {
    this_local = local_28;
  }
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (size_t i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}